

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

Int __thiscall
ipx::Model::PresolveIPMStartingPoint
          (Model *this,double *x_user,double *xl_user,double *xu_user,double *slack_user,
          double *y_user,double *zl_user,double *zu_user,Vector *x_solver,Vector *xl_solver,
          Vector *xu_solver,Vector *y_solver,Vector *zl_solver,Vector *zu_solver)

{
  bool bVar1;
  double *pdVar2;
  const_reference pvVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  byte *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  Int j_4;
  Int j_3;
  Int i_1;
  Int i;
  Int j_2;
  Int j_1;
  Int j;
  Vector zu_temp;
  Vector zl_temp;
  Vector y_temp;
  Vector slack_temp;
  Vector xu_temp;
  Vector xl_temp;
  Vector x_temp;
  size_t in_stack_fffffffffffffdf0;
  valarray<double> *this_00;
  double *in_stack_fffffffffffffdf8;
  valarray<double> *in_stack_fffffffffffffe00;
  Vector *in_stack_fffffffffffffe18;
  Vector *in_stack_fffffffffffffe20;
  Vector *in_stack_fffffffffffffe28;
  Vector *in_stack_fffffffffffffe30;
  Vector *in_stack_fffffffffffffe38;
  Model *in_stack_fffffffffffffe40;
  Vector *in_stack_fffffffffffffe50;
  Vector *in_stack_fffffffffffffe58;
  Vector *in_stack_fffffffffffffe98;
  Vector *in_stack_fffffffffffffea0;
  Vector *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  Vector *in_stack_fffffffffffffeb8;
  Model *in_stack_fffffffffffffec0;
  Vector *in_stack_fffffffffffffed0;
  Vector *in_stack_fffffffffffffed8;
  Vector *in_stack_fffffffffffffee0;
  Vector *in_stack_fffffffffffffee8;
  Vector *in_stack_fffffffffffffef0;
  Vector *in_stack_fffffffffffffef8;
  Vector *in_stack_ffffffffffffff00;
  Vector *in_stack_ffffffffffffff08;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_bc;
  valarray<double> local_b8;
  valarray<double> local_a8;
  valarray<double> local_98;
  valarray<double> local_88;
  valarray<double> local_78 [2];
  valarray<double> local_58;
  valarray<double> local_48 [4];
  Int local_4;
  
  if (((((in_RSI == 0) || (in_RDX == 0)) || (in_RCX == 0)) || ((in_R8 == 0 || (in_R9 == 0)))) ||
     ((in_stack_00000008 == 0 || (in_stack_00000010 == 0)))) {
    local_4 = 0x66;
  }
  else if ((*in_RDI & 1) == 0) {
    std::valarray<double>::valarray
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::valarray<double>::valarray
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::valarray<double>::valarray
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::valarray<double>::valarray
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::valarray<double>::valarray
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::valarray<double>::valarray
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::valarray<double>::valarray
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    this_00 = &local_b8;
    ScalePoint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
               in_stack_fffffffffffffe50,in_stack_fffffffffffffe58);
    for (local_bc = 0; local_bc < *(int *)(in_RDI + 0x170); local_bc = local_bc + 1) {
      pdVar2 = std::valarray<double>::operator[](local_48,(long)local_bc);
      bVar1 = std::isfinite(*pdVar2);
      if (!bVar1) {
        local_4 = 0x69;
        goto LAB_008445a9;
      }
    }
    for (local_c4 = 0; local_c4 < *(int *)(in_RDI + 0x170); local_c4 = local_c4 + 1) {
      in_stack_ffffffffffffff08 =
           (Vector *)std::valarray<double>::operator[](&local_58,(long)local_c4);
      if ((double)in_stack_ffffffffffffff08->_M_size < 0.0) {
LAB_00843dd7:
        local_4 = 0x69;
        goto LAB_008445a9;
      }
      in_stack_ffffffffffffff00 =
           (Vector *)
           std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x1e8),(long)local_c4);
      if (((double)in_stack_ffffffffffffff00->_M_size == -INFINITY) &&
         (!NAN((double)in_stack_ffffffffffffff00->_M_size))) {
        in_stack_fffffffffffffef8 =
             (Vector *)std::valarray<double>::operator[](&local_58,(long)local_c4);
        if (((double)in_stack_fffffffffffffef8->_M_size != INFINITY) ||
           (NAN((double)in_stack_fffffffffffffef8->_M_size))) goto LAB_00843dd7;
      }
      in_stack_fffffffffffffef0 =
           (Vector *)
           std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x1e8),(long)local_c4);
      if (((double)in_stack_fffffffffffffef0->_M_size != -INFINITY) ||
         (NAN((double)in_stack_fffffffffffffef0->_M_size))) {
        in_stack_fffffffffffffee8 =
             (Vector *)std::valarray<double>::operator[](&local_58,(long)local_c4);
        if (((double)in_stack_fffffffffffffee8->_M_size == INFINITY) &&
           (!NAN((double)in_stack_fffffffffffffee8->_M_size))) goto LAB_00843dd7;
      }
    }
    for (local_c8 = 0; local_c8 < *(int *)(in_RDI + 0x170); local_c8 = local_c8 + 1) {
      in_stack_fffffffffffffee0 =
           (Vector *)std::valarray<double>::operator[](local_78,(long)local_c8);
      if ((double)in_stack_fffffffffffffee0->_M_size < 0.0) {
LAB_00843f68:
        local_4 = 0x69;
        goto LAB_008445a9;
      }
      in_stack_fffffffffffffed8 =
           (Vector *)
           std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x1f8),(long)local_c8);
      if (((double)in_stack_fffffffffffffed8->_M_size == INFINITY) &&
         (!NAN((double)in_stack_fffffffffffffed8->_M_size))) {
        in_stack_fffffffffffffed0 =
             (Vector *)std::valarray<double>::operator[](local_78,(long)local_c8);
        if (((double)in_stack_fffffffffffffed0->_M_size != INFINITY) ||
           (NAN((double)in_stack_fffffffffffffed0->_M_size))) goto LAB_00843f68;
      }
      pdVar2 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x1f8),(long)local_c8);
      if ((*pdVar2 != INFINITY) || (NAN(*pdVar2))) {
        in_stack_fffffffffffffec0 =
             (Model *)std::valarray<double>::operator[](local_78,(long)local_c8);
        if ((*(double *)in_stack_fffffffffffffec0 == INFINITY) &&
           (!NAN(*(double *)in_stack_fffffffffffffec0))) goto LAB_00843f68;
      }
    }
    for (local_cc = 0; local_cc < *(int *)(in_RDI + 0x168); local_cc = local_cc + 1) {
      in_stack_fffffffffffffeb8 =
           (Vector *)std::valarray<double>::operator[](&local_88,(long)local_cc);
      in_stack_fffffffffffffeb7 = std::isfinite((double)in_stack_fffffffffffffeb8->_M_size);
      if (!(bool)in_stack_fffffffffffffeb7) {
LAB_00844118:
        local_4 = 0x69;
        goto LAB_008445a9;
      }
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x198),(long)local_cc);
      if (*pvVar3 == '=') {
        in_stack_fffffffffffffea8 =
             (Vector *)std::valarray<double>::operator[](&local_88,(long)local_cc);
        if (((double)in_stack_fffffffffffffea8->_M_size != 0.0) ||
           (NAN((double)in_stack_fffffffffffffea8->_M_size))) goto LAB_00844118;
      }
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x198),(long)local_cc);
      if (((*pvVar3 == '<') &&
          (in_stack_fffffffffffffea0 =
                (Vector *)std::valarray<double>::operator[](&local_88,(long)local_cc),
          (double)in_stack_fffffffffffffea0->_M_size < 0.0)) ||
         ((pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x198),
                               (long)local_cc), *pvVar3 == '>' &&
          (in_stack_fffffffffffffe98 =
                (Vector *)std::valarray<double>::operator[](&local_88,(long)local_cc),
          0.0 < (double)in_stack_fffffffffffffe98->_M_size)))) goto LAB_00844118;
    }
    for (local_d0 = 0; local_d0 < *(int *)(in_RDI + 0x168); local_d0 = local_d0 + 1) {
      pdVar2 = std::valarray<double>::operator[](&local_98,(long)local_d0);
      bVar1 = std::isfinite(*pdVar2);
      if (((!bVar1) ||
          ((pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x198),
                                (long)local_d0), *pvVar3 == '<' &&
           (pdVar2 = std::valarray<double>::operator[](&local_98,(long)local_d0), 0.0 < *pdVar2))))
         || ((pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                                 ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x198),
                                  (long)local_d0), *pvVar3 == '>' &&
             (pdVar2 = std::valarray<double>::operator[](&local_98,(long)local_d0), *pdVar2 < 0.0)))
         ) {
        local_4 = 0x69;
        goto LAB_008445a9;
      }
    }
    for (local_d4 = 0; local_d4 < *(int *)(in_RDI + 0x170); local_d4 = local_d4 + 1) {
      pdVar2 = std::valarray<double>::operator[](&local_a8,(long)local_d4);
      if ((*pdVar2 < 0.0) ||
         (pdVar2 = std::valarray<double>::operator[](&local_a8,(long)local_d4),
         INFINITY < *pdVar2 || *pdVar2 == INFINITY)) {
LAB_0084439a:
        local_4 = 0x69;
        goto LAB_008445a9;
      }
      pdVar2 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x1e8),(long)local_d4);
      if ((*pdVar2 == -INFINITY) && (!NAN(*pdVar2))) {
        pdVar2 = std::valarray<double>::operator[](&local_a8,(long)local_d4);
        if ((*pdVar2 != 0.0) || (NAN(*pdVar2))) goto LAB_0084439a;
      }
    }
    for (local_d8 = 0; local_d8 < *(int *)(in_RDI + 0x170); local_d8 = local_d8 + 1) {
      pdVar2 = std::valarray<double>::operator[](&local_b8,(long)local_d8);
      if ((*pdVar2 < 0.0) ||
         (pdVar2 = std::valarray<double>::operator[](&local_b8,(long)local_d8),
         INFINITY < *pdVar2 || *pdVar2 == INFINITY)) {
LAB_008444c2:
        local_4 = 0x69;
        goto LAB_008445a9;
      }
      pdVar2 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x1f8),(long)local_d8);
      if ((*pdVar2 == INFINITY) && (!NAN(*pdVar2))) {
        pdVar2 = std::valarray<double>::operator[](&local_b8,(long)local_d8);
        if ((*pdVar2 != 0.0) || (NAN(*pdVar2))) goto LAB_008444c2;
      }
    }
    this_00 = &local_b8;
    DualizeIPMStartingPoint
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               (Vector *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffef0,in_stack_fffffffffffffef8,
               in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
    local_4 = 0;
LAB_008445a9:
    std::valarray<double>::~valarray(this_00);
    std::valarray<double>::~valarray(this_00);
    std::valarray<double>::~valarray(this_00);
    std::valarray<double>::~valarray(this_00);
    std::valarray<double>::~valarray(this_00);
    std::valarray<double>::~valarray(this_00);
    std::valarray<double>::~valarray(this_00);
  }
  else {
    local_4 = 0x385;
  }
  return local_4;
}

Assistant:

Int Model::PresolveIPMStartingPoint(const double* x_user,
                                    const double* xl_user,
                                    const double* xu_user,
                                    const double* slack_user,
                                    const double* y_user,
                                    const double* zl_user,
                                    const double* zu_user,
                                    Vector& x_solver,
                                    Vector& xl_solver,
                                    Vector& xu_solver,
                                    Vector& y_solver,
                                    Vector& zl_solver,
                                    Vector& zu_solver) const {
    if (!x_user || !xl_user || !xu_user || !slack_user ||
        !y_user || !zl_user || !zu_user)
        return IPX_ERROR_argument_null;
    if (dualized_)
        return IPX_ERROR_not_implemented;

    // Copy user point into workspace and apply model scaling.
    Vector x_temp(x_user, num_var_);
    Vector xl_temp(xl_user, num_var_);
    Vector xu_temp(xu_user, num_var_);
    Vector slack_temp(slack_user, num_constr_);
    Vector y_temp(y_user, num_constr_);
    Vector zl_temp(zl_user, num_var_);
    Vector zu_temp(zu_user, num_var_);
    ScalePoint(x_temp, xl_temp, xu_temp, slack_temp,  y_temp, zl_temp, zu_temp);

    // Check that point is compatible with bounds.
    for (Int j = 0; j < num_var_; ++j) {
        if (!std::isfinite(x_temp[j]))
            return IPX_ERROR_invalid_vector;
    }
    for (Int j = 0; j < num_var_; ++j) {
        if (!(xl_temp[j] >= 0.0) ||
            (scaled_lbuser_[j] == -INFINITY && xl_temp[j] != INFINITY) ||
            (scaled_lbuser_[j] != -INFINITY && xl_temp[j] == INFINITY))
            return IPX_ERROR_invalid_vector;
    }
    for (Int j = 0; j < num_var_; ++j) {
        if (!(xu_temp[j] >= 0.0) ||
            (scaled_ubuser_[j] == INFINITY && xu_temp[j] != INFINITY) ||
            (scaled_ubuser_[j] != INFINITY && xu_temp[j] == INFINITY))
            return IPX_ERROR_invalid_vector;
    }
    for (Int i = 0; i < num_constr_; ++i) {
        if (!std::isfinite(slack_temp[i]) ||
            (constr_type_[i] == '=' && !(slack_temp[i] == 0.0)) ||
            (constr_type_[i] == '<' && !(slack_temp[i] >= 0.0)) ||
            (constr_type_[i] == '>' && !(slack_temp[i] <= 0.0)) )
            return IPX_ERROR_invalid_vector;
    }
    for (Int i = 0; i < num_constr_; ++i) {
        if (!std::isfinite(y_temp[i]) ||
            (constr_type_[i] == '<' && !(y_temp[i] <= 0.0)) ||
            (constr_type_[i] == '>' && !(y_temp[i] >= 0.0)) )
            return IPX_ERROR_invalid_vector;
    }
    for (Int j = 0; j < num_var_; ++j) {
        if (!(zl_temp[j] >= 0.0 && zl_temp[j] < INFINITY) ||
            (scaled_lbuser_[j] == -INFINITY && zl_temp[j] != 0.0))
            return IPX_ERROR_invalid_vector;
    }
    for (Int j = 0; j < num_var_; ++j) {
        if (!(zu_temp[j] >= 0.0 && zu_temp[j] < INFINITY) ||
            (scaled_ubuser_[j] == INFINITY && zu_temp[j] != 0.0))
            return IPX_ERROR_invalid_vector;
    }

    DualizeIPMStartingPoint(x_temp, xl_temp, xu_temp, slack_temp,
                            y_temp, zl_temp, zu_temp,
                            x_solver, xl_solver, xu_solver,
                            y_solver, zl_solver, zu_solver);
    return 0;
}